

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::SetUnreachable(TypeChecker *this)

{
  Result RVar1;
  Label *label;
  
  RVar1 = TopLabel(this,&label);
  if (RVar1.enum_ != Error) {
    label->unreachable = true;
    ResetTypeStackToLabel(this,label);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::SetUnreachable() {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  label->unreachable = true;
  ResetTypeStackToLabel(label);
  return Result::Ok;
}